

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O3

void * __thiscall cppnet::PoolAlloter::ChunkAlloc(PoolAlloter *this,uint32_t size,uint32_t *nums)

{
  pointer *pppcVar1;
  element_type *peVar2;
  iterator __position;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = *nums * size;
  pcVar5 = this->_pool_start;
  uVar3 = *(int *)&this->_pool_end - (int)pcVar5;
  if (uVar3 < uVar7) {
    do {
      uVar8 = uVar7;
      if (size <= uVar3) {
        *nums = uVar3 / size;
        uVar6 = (ulong)((uVar3 / size) * size);
        break;
      }
      if (uVar3 != 0) {
        *(MemNode **)pcVar5 =
             (this->_free_list).
             super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start[(uVar3 + 7 >> 3) - 1];
        (this->_free_list).
        super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start[(size + 7 >> 3) - 1] =
             (MemNode *)this->_pool_start;
      }
      peVar2 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar4 = (*peVar2->_vptr_Alloter[2])(peVar2,(ulong)uVar8);
      this->_pool_start = (char *)CONCAT44(extraout_var,iVar4);
      __position._M_current =
           (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                  ((vector<char*,std::allocator<char*>> *)&this->_malloc_vec,__position,
                   &this->_pool_start);
      }
      else {
        *__position._M_current = (char *)CONCAT44(extraout_var,iVar4);
        pppcVar1 = &(this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      pcVar5 = this->_pool_start;
      this->_pool_end = pcVar5 + uVar8;
      uVar7 = *nums * size;
      uVar6 = (ulong)uVar7;
      uVar3 = uVar8;
    } while (uVar8 < uVar7);
  }
  else {
    uVar6 = (ulong)uVar7;
  }
  this->_pool_start = pcVar5 + uVar6;
  return pcVar5;
}

Assistant:

void* PoolAlloter::ChunkAlloc(uint32_t size, uint32_t& nums) {
    char* res;
    uint32_t need_bytes = size * nums;
    uint32_t left_bytes = uint32_t(_pool_end - _pool_start);

    //pool is enough
    if (left_bytes >= need_bytes) {
        res = _pool_start;
        _pool_start += need_bytes;
        return res;
    
    } else if (left_bytes >= size) {
        nums = left_bytes / size;
        need_bytes = size * nums;
        res = _pool_start;
        _pool_start += need_bytes;
        return res;

    } 
    uint32_t bytes_to_get = size * nums;

    if (left_bytes > 0) {
        MemNode* my_free = _free_list[FreeListIndex(left_bytes)];
        ((MemNode*)_pool_start)->_next = my_free;
        _free_list[FreeListIndex(size)] = (MemNode*)_pool_start;
    }

    _pool_start = (char*)_alloter->Malloc(bytes_to_get);

    _malloc_vec.push_back(_pool_start);
    _pool_end = _pool_start + bytes_to_get;
    return ChunkAlloc(size, nums);
}